

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O2

void __thiscall
soul::ArrayWithPreallocation<soul::Type,_8UL>::push_back
          (ArrayWithPreallocation<soul::Type,_8UL> *this,Type *item)

{
  reserve(this,this->numActive + 1);
  Type::Type(this->items + this->numActive,item);
  this->numActive = this->numActive + 1;
  return;
}

Assistant:

void push_back (const Item& item)                       { reserve (numActive + 1); new (items + numActive) Item (item); ++numActive; }